

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O1

future<dap::ResponseOrError<dap::SetBreakpointsResponse>_> __thiscall
dap::Session::send<dap::SetBreakpointsRequest,void>(Session *this,SetBreakpointsRequest *request)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Session SVar2;
  element_type *peVar3;
  char cVar4;
  TypeInfo *pTVar5;
  TypeInfo *pTVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  future<dap::ResponseOrError<dap::SetBreakpointsResponse>_> fVar8;
  promise<dap::ResponseOrError<dap::SetBreakpointsResponse>_> promise;
  Session local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  Error local_b8;
  vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  element_type *local_60;
  unique_lock<std::mutex> local_58;
  vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_> local_48;
  
  local_c8._vptr_Session = (_func_int **)0x0;
  local_60 = (element_type *)this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>>,std::allocator<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>>>>
            (&local_c0,
             (promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>_> **)&local_c8,
             (allocator<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>_>_>
              *)&local_98);
  pTVar5 = TypeOf<dap::SetBreakpointsRequest>::type();
  pTVar6 = TypeOf<dap::SetBreakpointsResponse>::type();
  _Var7._M_pi = local_c0._M_pi;
  SVar2._vptr_Session = local_c8._vptr_Session;
  if ((pointer)local_c0._M_pi != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
    }
  }
  local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paStack_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
  local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  ((local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_start)->column).val.val = (int64_t)SVar2._vptr_Session;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &((local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
      super__Vector_impl_data._M_start)->column).set = _Var7._M_pi;
  paStack_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)std::
                  _Function_handler<void_(const_void_*,_const_dap::Error_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:422:20)>
                  ::_M_invoke;
  local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_void_*,_const_dap::Error_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:422:20)>
                ::_M_manager;
  cVar4 = (**(code **)((long)&((request->breakpoints).val.
                               super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>
                               ._M_impl.super__Vector_impl_data._M_start)->hitCondition + 0x18))
                    (request,pTVar5,pTVar6);
  peVar3 = local_60;
  _Var7._M_pi = extraout_RDX;
  if (local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage)(&local_98,&local_98,3);
    _Var7._M_pi = extraout_RDX_00;
  }
  if (cVar4 == '\0') {
    Error::Error(&local_b8,"Failed to send request");
    local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar1 = &local_b8.message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.message._M_dataplus._M_p == paVar1) {
      local_70._8_8_ = local_b8.message.field_2._8_8_;
      paStack_80 = &local_70;
    }
    else {
      paStack_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_b8.message._M_dataplus._M_p;
    }
    local_70._M_allocated_capacity._1_7_ = local_b8.message.field_2._M_allocated_capacity._1_7_;
    local_70._M_local_buf[0] = local_b8.message.field_2._M_local_buf[0];
    local_78 = local_b8.message._M_string_length;
    local_b8.message._M_string_length = 0;
    local_b8.message.field_2._M_local_buf[0] = '\0';
    local_58._M_device = (mutex_type *)(local_c8._vptr_Session + 7);
    local_58._M_owns = false;
    local_b8.message._M_dataplus._M_p = (pointer)paVar1;
    std::unique_lock<std::mutex>::lock(&local_58);
    SVar2._vptr_Session = local_c8._vptr_Session;
    local_58._M_owns = true;
    local_48.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*local_c8._vptr_Session;
    local_48.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_c8._vptr_Session[1];
    local_48.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_c8._vptr_Session[2];
    *local_c8._vptr_Session =
         (_func_int *)
         local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_c8._vptr_Session[1] =
         (_func_int *)
         local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_c8._vptr_Session[2] =
         (_func_int *)
         local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>::~vector(&local_48);
    std::__cxx11::string::operator=((string *)(SVar2._vptr_Session + 3),(string *)&paStack_80);
    *(undefined1 *)(local_c8._vptr_Session + 0x12) = 1;
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock(&local_58);
    if (paStack_80 != &local_70) {
      operator_delete(paStack_80,local_70._M_allocated_capacity + 1);
    }
    std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>::~vector(&local_98);
    _Var7._M_pi = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.message._M_dataplus._M_p != &local_b8.message.field_2) {
      operator_delete(local_b8.message._M_dataplus._M_p,
                      CONCAT71(local_b8.message.field_2._M_allocated_capacity._1_7_,
                               local_b8.message.field_2._M_local_buf[0]) + 1);
      _Var7._M_pi = extraout_RDX_02;
    }
  }
  (peVar3->val).response.breakpoints.
  super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_c8._vptr_Session;
  (peVar3->val).response.breakpoints.
  super__Vector_base<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_c0._M_pi;
  if ((pointer)local_c0._M_pi != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
    }
  }
  if ((pointer)local_c0._M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
    _Var7._M_pi = extraout_RDX_03;
  }
  fVar8.state.
  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var7._M_pi;
  fVar8.state.
  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar3;
  return (future<dap::ResponseOrError<dap::SetBreakpointsResponse>_>)
         fVar8.state.
         super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::SetBreakpointsResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

future<ResponseOrError<typename T::Response>> Session::send(const T& request) {
  using Response = typename T::Response;
  promise<ResponseOrError<Response>> promise;
  auto sent = send(TypeOf<T>::type(), TypeOf<Response>::type(), &request,
                   [=](const void* result, const Error* error) {
                     if (error != nullptr) {
                       promise.set_value(ResponseOrError<Response>(*error));
                     } else {
                       promise.set_value(ResponseOrError<Response>(
                           *reinterpret_cast<const Response*>(result)));
                     }
                   });
  if (!sent) {
    promise.set_value(Error("Failed to send request"));
  }
  return promise.get_future();
}